

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O0

word Extra_Truth6MinimumRoundOne(word t,int iVar,char *pCanonPerm,uint *pCanonPhase)

{
  uint uVar1;
  word wVar2;
  word wVar3;
  uint local_44;
  ulong uStack_40;
  uint info;
  word tMin;
  word tCur;
  uint *pCanonPhase_local;
  char *pCanonPerm_local;
  int iVar_local;
  word t_local;
  
  if ((-1 < iVar) && (iVar < 5)) {
    wVar2 = Extra_Truth6ChangePhase(t,iVar);
    uStack_40 = t;
    if (wVar2 < t) {
      uStack_40 = wVar2;
    }
    local_44 = (uint)(wVar2 < t);
    wVar2 = Extra_Truth6ChangePhase(t,iVar + 1);
    if (wVar2 < uStack_40) {
      local_44 = 2;
      uStack_40 = wVar2;
    }
    wVar2 = Extra_Truth6ChangePhase(wVar2,iVar);
    if (wVar2 < uStack_40) {
      local_44 = 3;
      uStack_40 = wVar2;
    }
    wVar2 = Extra_Truth6SwapAdjacent(t,iVar);
    if (wVar2 < uStack_40) {
      local_44 = 4;
      uStack_40 = wVar2;
    }
    wVar3 = Extra_Truth6ChangePhase(wVar2,iVar);
    if (wVar3 < uStack_40) {
      local_44 = 6;
      uStack_40 = wVar3;
    }
    wVar2 = Extra_Truth6ChangePhase(wVar2,iVar + 1);
    if (wVar2 < uStack_40) {
      local_44 = 5;
      uStack_40 = wVar2;
    }
    t_local = Extra_Truth6ChangePhase(wVar2,iVar);
    if (t_local < uStack_40) {
      uVar1 = adjustInfoAfterSwap(pCanonPerm,*pCanonPhase,iVar,7);
      *pCanonPhase = uVar1;
    }
    else {
      uVar1 = adjustInfoAfterSwap(pCanonPerm,*pCanonPhase,iVar,local_44);
      *pCanonPhase = uVar1;
      t_local = uStack_40;
    }
    return t_local;
  }
  __assert_fail("iVar >= 0 && iVar < 5",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/lucky/luckyFast6.c"
                ,0x69,"word Extra_Truth6MinimumRoundOne(word, int, char *, unsigned int *)");
}

Assistant:

static inline word Extra_Truth6MinimumRoundOne( word t, int v )
{
    word tCur, tMin = t; // ab 
    assert( v >= 0 && v < 5 );

    tCur = Extra_Truth6ChangePhase( t, v );    // !ab
    tMin = Abc_MinWord( tMin, tCur );
    tCur = Extra_Truth6ChangePhase( t, v+1 );  // a!b
    tMin = Abc_MinWord( tMin, tCur );
    tCur = Extra_Truth6ChangePhase( tCur, v ); // !a!b
    tMin = Abc_MinWord( tMin, tCur );

    t    = Extra_Truth6SwapAdjacent( t, v );   // ba
    tMin = Abc_MinWord( tMin, t );

    tCur = Extra_Truth6ChangePhase( t, v );    // !ba
    tMin = Abc_MinWord( tMin, tCur );
    tCur = Extra_Truth6ChangePhase( t, v+1 );  // b!a
    tMin = Abc_MinWord( tMin, tCur );
    tCur = Extra_Truth6ChangePhase( tCur, v ); // !b!a
    tMin = Abc_MinWord( tMin, tCur );

    return tMin;
}